

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<VectorWriter,int,unsigned_long,long,unsigned_long,ParamsWrapper<CAddress::SerParams,CService_const>>
               (VectorWriter *s,int *args,unsigned_long *args_1,long *args_2,unsigned_long *args_3,
               ParamsWrapper<CAddress::SerParams,_const_CService> *args_4)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata32<VectorWriter>(s,*args);
  ser_writedata64<VectorWriter>(s,*args_1);
  ser_writedata64<VectorWriter>(s,*args_2);
  ser_writedata64<VectorWriter>(s,*args_3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ParamsWrapper<CAddress::SerParams,_const_CService>::Serialize<VectorWriter>(args_4,s);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}